

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Glucose::Solver::relocAll(Solver *this,ClauseAllocator *to)

{
  bool bVar1;
  int iVar2;
  CRef CVar3;
  int iVar4;
  vec<Glucose::Solver::Watcher> *pvVar5;
  Lit *pLVar6;
  Clause *this_00;
  long in_RDI;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  Var v_1;
  int i;
  int j_2;
  vec<Glucose::Solver::Watcher> *ws3;
  int j_1;
  vec<Glucose::Solver::Watcher> *ws2;
  int j;
  vec<Glucose::Solver::Watcher> *ws;
  Lit p;
  int s;
  int v;
  Ref in_stack_fffffffffffffefc;
  Solver *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
  *in_stack_ffffffffffffff10;
  ClauseAllocator *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  ClauseAllocator *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_50;
  int local_4c;
  int local_3c;
  int local_2c;
  int local_18;
  int local_14;
  
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(in_stack_ffffffffffffff10);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(in_stack_ffffffffffffff10);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(in_stack_ffffffffffffff10);
  for (local_14 = 0; iVar2 = nVars((Solver *)0x127f81), local_14 < iVar2; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
      mkLit(local_14,local_18 != 0);
      pvVar5 = OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
               ::operator[](in_stack_ffffffffffffff10,
                            (Lit *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      for (local_2c = 0; iVar2 = vec<Glucose::Solver::Watcher>::size(pvVar5), local_2c < iVar2;
          local_2c = local_2c + 1) {
        vec<Glucose::Solver::Watcher>::operator[](pvVar5,local_2c);
        ClauseAllocator::reloc
                  (in_stack_ffffffffffffff70,
                   (CRef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
      }
      pvVar5 = OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
               ::operator[](in_stack_ffffffffffffff10,
                            (Lit *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      local_3c = 0;
      while (in_stack_ffffffffffffff7c = local_3c,
            iVar2 = vec<Glucose::Solver::Watcher>::size(pvVar5), in_stack_ffffffffffffff7c < iVar2)
      {
        in_stack_ffffffffffffff70 = (ClauseAllocator *)(in_RDI + 0x340);
        vec<Glucose::Solver::Watcher>::operator[](pvVar5,local_3c);
        ClauseAllocator::reloc
                  (in_stack_ffffffffffffff70,
                   (CRef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
        local_3c = local_3c + 1;
      }
      pvVar5 = OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
               ::operator[](in_stack_ffffffffffffff10,
                            (Lit *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      local_4c = 0;
      while (in_stack_ffffffffffffff6c = local_4c,
            iVar2 = vec<Glucose::Solver::Watcher>::size(pvVar5), in_stack_ffffffffffffff6c < iVar2)
      {
        in_stack_ffffffffffffff60 = (ClauseAllocator *)(in_RDI + 0x340);
        vec<Glucose::Solver::Watcher>::operator[](pvVar5,local_4c);
        ClauseAllocator::reloc
                  (in_stack_ffffffffffffff70,
                   (CRef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
        local_4c = local_4c + 1;
      }
    }
  }
  local_50 = 0;
  do {
    iVar2 = vec<Glucose::Lit>::size((vec<Glucose::Lit> *)(in_RDI + 0x288));
    if (iVar2 <= local_50) {
      for (local_5c = 0; iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x218)),
          local_5c < iVar2; local_5c = local_5c + 1) {
        vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x218),local_5c);
        ClauseAllocator::reloc
                  (in_stack_ffffffffffffff70,
                   (CRef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
      }
      for (local_60 = 0; iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x228)),
          local_60 < iVar2; local_60 = local_60 + 1) {
        vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x228),local_60);
        ClauseAllocator::reloc
                  (in_stack_ffffffffffffff70,
                   (CRef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
      }
      for (local_64 = 0; iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x208)),
          local_64 < iVar2; local_64 = local_64 + 1) {
        vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x208),local_64);
        ClauseAllocator::reloc
                  (in_stack_ffffffffffffff70,
                   (CRef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
      }
      local_68 = 0;
      while (iVar2 = local_68,
            iVar4 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x238)), iVar2 < iVar4) {
        vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x238),local_68);
        ClauseAllocator::reloc
                  (in_stack_ffffffffffffff70,
                   (CRef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   in_stack_ffffffffffffff60);
        local_68 = local_68 + 1;
      }
      return;
    }
    pLVar6 = vec<Glucose::Lit>::operator[]((vec<Glucose::Lit> *)(in_RDI + 0x288),local_50);
    iVar2 = var((Lit)pLVar6->x);
    CVar3 = reason(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    if (CVar3 != 0xffffffff) {
      reason(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      this_00 = ClauseAllocator::operator[]
                          ((ClauseAllocator *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      bVar1 = Clause::reloced(this_00);
      if (!bVar1) {
        reason(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        ClauseAllocator::operator[]
                  ((ClauseAllocator *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        bVar1 = locked((Solver *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (Clause *)in_stack_ffffffffffffff70);
        if (!bVar1) goto LAB_00128339;
      }
      vec<Glucose::Solver::VarData>::operator[]
                ((vec<Glucose::Solver::VarData> *)(in_RDI + 0x2b8),iVar2);
      ClauseAllocator::reloc
                (in_stack_ffffffffffffff70,
                 (CRef *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff60);
    }
LAB_00128339:
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

void Solver::relocAll(ClauseAllocator &to) {
    // All watchers:
    // for (int i = 0; i < watches.size(); i++)
    watches.cleanAll();
    watchesBin.cleanAll();
    unaryWatches.cleanAll();
    for(int v = 0; v < nVars(); v++)
        for(int s = 0; s < 2; s++) {
            Lit p = mkLit(v, s);
            // printf(" >>> RELOCING: %s%d\n", sign(p)?"-":"", var(p)+1);
            vec <Watcher> &ws = watches[p];
            for(int j = 0; j < ws.size(); j++)
                ca.reloc(ws[j].cref, to);
            vec <Watcher> &ws2 = watchesBin[p];
            for(int j = 0; j < ws2.size(); j++)
                ca.reloc(ws2[j].cref, to);
            vec <Watcher> &ws3 = unaryWatches[p];
            for(int j = 0; j < ws3.size(); j++)
                ca.reloc(ws3[j].cref, to);
        }

    // All reasons:
    //
    for(int i = 0; i < trail.size(); i++) {
        Var v = var(trail[i]);

        if(reason(v) != CRef_Undef && (ca[reason(v)].reloced() || locked(ca[reason(v)])))
            ca.reloc(vardata[v].reason, to);
    }

    // All learnt:
    //
    for(int i = 0; i < learnts.size(); i++)
        ca.reloc(learnts[i], to);

    for(int i = 0; i < permanentLearnts.size(); i++)
        ca.reloc(permanentLearnts[i], to);

    // All original:
    //
    for(int i = 0; i < clauses.size(); i++)
        ca.reloc(clauses[i], to);

    for(int i = 0; i < unaryWatchedClauses.size(); i++)
        ca.reloc(unaryWatchedClauses[i], to);
}